

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O1

optional<metaf::VisibilityGroup> *
metaf::VisibilityGroup::parse
          (optional<metaf::VisibilityGroup> *__return_storage_ptr__,string *group,
          ReportPart reportPart,ReportMetadata *reportMetadata)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  char cVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  optional<metaf::Distance> v;
  _Storage<metaf::Distance,_true> local_40;
  char local_30;
  
  if (reportPart == RMK) {
    iVar2 = std::__cxx11::string::compare((char *)group);
    if (iVar2 == 0) {
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
        _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0xc) = 0
      ;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x10) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x1c) =
           0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x20) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x30) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x3c) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x48) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x54) =
           0;
      (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.incompleteText = VIS;
      goto LAB_001ae7bb;
    }
    iVar2 = std::__cxx11::string::compare((char *)group);
    if (iVar2 == 0) {
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
        _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload = 5;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)group);
      if (iVar2 != 0) {
        iVar2 = std::__cxx11::string::compare((char *)group);
        if (iVar2 == 0) {
          *(undefined8 *)
           &(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
            _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload = 0xf;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>
                   )._M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload +
           0xc) = 0;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>
                   )._M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload +
           0x10) = 0;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>
                   )._M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload +
           0x1c) = 0;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>
                   )._M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload +
           0x20) = 0;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>
                   )._M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload +
           0x30) = 0;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>
                   )._M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload +
           0x3c) = 0;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>
                   )._M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload +
           0x48) = 0;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>
                   )._M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload +
           0x54) = 0;
          (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
          _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.
          incompleteText = NONE;
          goto LAB_001ae7bb;
        }
        iVar2 = std::__cxx11::string::compare((char *)group);
        if (iVar2 == 0) {
          *(undefined8 *)
           &(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
            _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload = 0x10;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>
                   )._M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload +
           0xc) = 0;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>
                   )._M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload +
           0x10) = 0;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>
                   )._M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload +
           0x1c) = 0;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>
                   )._M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload +
           0x20) = 0;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>
                   )._M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload +
           0x30) = 0;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>
                   )._M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload +
           0x3c) = 0;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>
                   )._M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload +
           0x48) = 0;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>
                   )._M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload +
           0x54) = 0;
          (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
          _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.
          incompleteText = VISNO;
          goto LAB_001ae7bb;
        }
        iVar2 = std::__cxx11::string::compare((char *)group);
        if (iVar2 == 0) {
          *(undefined8 *)
           &(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
            _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload = 0xe;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>
                   )._M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload +
           0xc) = 0;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>
                   )._M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload +
           0x10) = 0;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>
                   )._M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload +
           0x1c) = 0;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>
                   )._M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload +
           0x20) = 0;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>
                   )._M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload +
           0x30) = 0;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>
                   )._M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload +
           0x3c) = 0;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>
                   )._M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload +
           0x48) = 0;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>
                   )._M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload +
           0x54) = 0;
          (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
          _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.
          incompleteText = RVR;
          goto LAB_001ae7bb;
        }
        goto LAB_001ae6ad;
      }
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
        _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload = 6;
    }
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0xc) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x10) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x1c) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x20) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x30) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x3c) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x48) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x54) = 0;
    (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.incompleteText =
         SFC_OR_TWR;
LAB_001ae7bb:
    (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::VisibilityGroup>._M_engaged = true;
    return __return_storage_ptr__;
  }
LAB_001ae6ad:
  if ((reportPart & ~HEADER) == METAR) {
    uVar9 = 0;
    if (group->_M_string_length - 4 < 0xfffffffffffffffd) {
      uVar4 = 0;
      uVar8 = 0;
      uVar7 = 0;
      uVar6 = 0;
      cVar5 = '\0';
    }
    else {
      lVar3 = std::__cxx11::string::find((char)group,0x2f);
      uVar4 = 0;
      uVar8 = 0;
      uVar7 = 0;
      uVar6 = 0;
      cVar5 = '\0';
      if (lVar3 == -1) {
        Distance::fromMileString((optional<metaf::Distance> *)&local_40._M_value,group,true);
        cVar5 = local_30;
        if (local_30 == '\x01') {
          uVar1 = CONCAT13(local_40._11_1_,
                           CONCAT21(local_40._9_2_,
                                    local_40._M_value.dist.
                                    super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                    super__Optional_payload_base<unsigned_int>._M_engaged));
          uVar7 = local_40._0_8_ & 0xffffffff;
          uVar6 = local_40._0_8_ & 0xffffffff00000000;
          uVar4 = (ulong)local_40._M_value.distUnit << 0x20;
          uVar9 = (ulong)uVar1 & 0xff;
          uVar8 = (ulong)(uVar1 & 0xffffff00);
        }
        else {
          uVar9 = 0;
          uVar4 = 0;
          uVar8 = 0;
          uVar7 = 0;
          uVar6 = 0;
        }
      }
    }
    if ((cVar5 == '\0') || (uVar7 != 0)) {
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.
               dirSecTo.super__Optional_base<metaf::Direction,_true,_true>._M_payload + 4) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x58) =
           0;
      (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.dirSecFrom.
      super__Optional_base<metaf::Direction,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::Direction>._M_payload = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.
               dirSecFrom.super__Optional_base<metaf::Direction,_true,_true>._M_payload + 8) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.
               dir.super__Optional_base<metaf::Direction,_true,_true>._M_payload + 8) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.
               rw.super__Optional_base<metaf::Runway,_true,_true>._M_payload + 4) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x20) =
           0;
      (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.dir.
      super__Optional_base<metaf::Direction,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::Direction>._M_payload = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x10) =
           0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x18) =
           0;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
        _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 8) = 0;
    }
    else {
      (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.visType = PREVAILING;
      *(ulong *)((long)&(__return_storage_ptr__->
                        super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                        super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 4) = uVar6
      ;
      *(ulong *)((long)&(__return_storage_ptr__->
                        super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                        super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0xc) =
           uVar4 | uVar9 | uVar8;
      (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.visMax.distModifier =
           NONE;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x1c) =
           0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x20) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x30) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x3c) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x48) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x54) =
           0;
      (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.incompleteText =
           INTEGER;
      (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::VisibilityGroup>._M_engaged = true;
    }
    if ((__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
        _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_engaged != false) {
      return __return_storage_ptr__;
    }
    fromMeters(__return_storage_ptr__,group);
    if ((__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
        _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_engaged != false) {
      return __return_storage_ptr__;
    }
    Distance::fromMileString((optional<metaf::Distance> *)&local_40._M_value,group,false);
    if (local_30 == '\x01') {
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0xf) =
           local_40._11_1_;
      *(undefined2 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0xd) =
           local_40._9_2_;
      (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.visType = PREVAILING;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 4) =
           local_40._0_8_;
      *(bool *)((long)&(__return_storage_ptr__->
                       super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                       super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0xc) =
           local_40._M_value.dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_engaged;
      (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.vis.distUnit =
           local_40._M_value.distUnit;
      (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.visMax.distModifier =
           NONE;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x1c) =
           0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x20) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x30) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x3c) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x48) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x54) =
           0;
      (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.incompleteText = NONE
      ;
      goto LAB_001ae7bb;
    }
  }
  if ((reportPart == METAR) &&
     (fromRvr(__return_storage_ptr__,group),
     (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
     super__Optional_payload_base<metaf::VisibilityGroup>._M_engaged != false)) {
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::VisibilityGroup>._M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

std::optional<VisibilityGroup> VisibilityGroup::parse(const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void)reportMetadata;
	if (reportPart == ReportPart::RMK) {
		if (group == "VIS") 
			return VisibilityGroup(Type::PREVAILING, IncompleteText::VIS);
		if (group == "SFC")
			return VisibilityGroup(Type::SURFACE, IncompleteText::SFC_OR_TWR);
		if (group == "TWR")
			return VisibilityGroup(Type::TOWER, IncompleteText::SFC_OR_TWR);
		if (group == "RVRNO") 
			return VisibilityGroup(Type::RVRNO, IncompleteText::NONE);
		if (group == "VISNO") 
			return VisibilityGroup(Type::VISNO, IncompleteText::VISNO);
		if (group == "RVR") 
			return VisibilityGroup(Type::RVR_MISG, IncompleteText::RVR);
	}
	if (reportPart == ReportPart::METAR || reportPart == ReportPart::TAF) {
		if (const auto v = fromIncompleteInteger(group); v.has_value()) return v;
		if (const auto v = fromMeters(group); v.has_value()) return v;
		if (const auto v = Distance::fromMileString(group); v.has_value()) {
			VisibilityGroup result;
			result.vis = *v;
			return result;
		}
	}
	if (reportPart == ReportPart::METAR) {
		if (const auto v = fromRvr(group); v.has_value()) return v;
	}
	return std::optional<VisibilityGroup>();
}